

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::destroy_pipeline(InnerProduct *this,Option *opt)

{
  size_type sVar1;
  reference ppLVar2;
  undefined8 in_RSI;
  long in_RDI;
  int i;
  int local_14;
  
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x28))(*(long **)(in_RDI + 0x1a0),in_RSI);
    if (*(long **)(in_RDI + 0x1a0) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x1a0) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x1a0) = 0;
  }
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a8));
    if ((int)sVar1 <= local_14) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a8),
                         (long)local_14);
    (*(*ppLVar2)->_vptr_Layer[5])(*ppLVar2,in_RSI);
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a8),
                         (long)local_14);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x16836b);
  return 0;
}

Assistant:

int InnerProduct::destroy_pipeline(const Option& opt)
{
    if (quantize)
    {
        quantize->destroy_pipeline(opt);
        delete quantize;
        quantize = 0;
    }

    for (int i=0; i<(int)dequantize_ops.size(); i++)
    {
        dequantize_ops[i]->destroy_pipeline(opt);
        delete dequantize_ops[i];
    }
    dequantize_ops.clear();

    return 0;
}